

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O0

bool isParamValid(char *p,uint64_t *value)

{
  ostream *poVar1;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  __integer_from_chars_result_type<unsigned_long> _Var3;
  __integer_from_chars_result_type<unsigned_long> result;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  strlen(in_RDI);
  _Var3 = std::from_chars<unsigned_long>
                    (in_RDI,in_RSI,
                     (unsigned_long *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  bVar2 = _Var3.ec == 0;
  if (!bVar2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: wrong parameter type: ");
    poVar1 = std::operator<<(poVar1,in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return bVar2;
}

Assistant:

static bool isParamValid(char const* p, uint64_t& value) {
  auto result = std::from_chars(p, p + strlen(p), value);
  if (result.ec != std::errc()) {
    std::cerr << "Error: wrong parameter type: " << p << std::endl;
    return false;
  }
  return true;
}